

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

CVmVarHeapHybrid_hdr * __thiscall
CVmVarHeapHybrid_head::alloc(CVmVarHeapHybrid_head *this,size_t param_1)

{
  CVmVarHeapHybrid *pCVar1;
  CVmVarHeapHybrid_hdr *pCVar2;
  char *pcVar3;
  CVmVarHeapHybrid_array *pCVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  
  if (this->first_free_ == (void *)0x0) {
    uVar8 = this->cell_size_ + 0xf & 0xfffffffffffffff8;
    pCVar4 = (CVmVarHeapHybrid_array *)malloc(this->page_count_ * uVar8 + 0x10);
    if (pCVar4 == (CVmVarHeapHybrid_array *)0x0) {
      err_throw(0xca);
    }
    pCVar1 = this->mem_mgr_;
    pCVar4->next_array = pCVar1->first_array_;
    pCVar1->first_array_ = pCVar4;
    sVar6 = this->page_count_;
    if (sVar6 != 0) {
      pcVar3 = pCVar4->mem;
      pcVar7 = (char *)this->first_free_;
      do {
        pcVar5 = pcVar3;
        *(char **)pcVar5 = pcVar7;
        sVar6 = sVar6 - 1;
        pcVar3 = pcVar5 + uVar8;
        pcVar7 = pcVar5;
      } while (sVar6 != 0);
      this->first_free_ = pcVar5 + uVar8 + -uVar8;
    }
  }
  pCVar2 = (CVmVarHeapHybrid_hdr *)this->first_free_;
  this->first_free_ = pCVar2->block;
  pCVar2->block = &this->super_CVmVarHeapHybrid_block;
  return pCVar2;
}

Assistant:

CVmVarHeapHybrid_hdr *CVmVarHeapHybrid_head::alloc(size_t)
{
    /* if there isn't an entry, allocate another array */
    if (first_free_ == 0)
    {
        CVmVarHeapHybrid_array *arr;
        size_t real_cell_size;
        char *p;
        size_t cnt;
        
        /* 
         *   Allocate another page.  We need space for the array header
         *   itself, plus space for all of the cells.  We want page_count_
         *   cells, each of size cell_size_ plus the size of the per-cell
         *   header, rounded to the worst-case alignment size for the
         *   platform.  
         */
        real_cell_size = osrndsz(cell_size_
                                 + osrndsz(sizeof(CVmVarHeapHybrid_hdr)));
        arr = (CVmVarHeapHybrid_array *)
              t3malloc(sizeof(CVmVarHeapHybrid_array)
                       + (page_count_ * real_cell_size));

        /* if that failed, throw an error */
        if (arr == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* link the array into the master list */
        arr->next_array = mem_mgr_->first_array_;
        mem_mgr_->first_array_ = arr;

        /* 
         *   Build the free list.  Each cell goes into the free list; the
         *   'next' pointer is stored in the data area of the cell. 
         */
        for (p = arr->mem, cnt = page_count_ ; cnt > 0 ;
             p += real_cell_size, --cnt)
        {
            /* link this one into the free list */
            *(void **)p = first_free_;
            first_free_ = (void *)p;
        }
    }
    
    /* remember the return value */
    CVmVarHeapHybrid_hdr *ret = (CVmVarHeapHybrid_hdr *)first_free_;

    /* 
     *   when we initialized or last freed this entry, we stored a pointer
     *   to the next item in the free list in the object's data - retrieve
     *   this pointer now, and update our free list head to point to the
     *   next item 
     */
    first_free_ = *(void **)first_free_;

    /* fill in the block's pointer to the allocating heap (i.e., this) */
    ret->block = this;

    /* return the item */
    return ret;
}